

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QAbstractAnimationTimer*>::emplace<QAbstractAnimationTimer*&>
          (QPodArrayOps<QAbstractAnimationTimer_*> *this,qsizetype i,QAbstractAnimationTimer **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  QAbstractAnimationTimer **ppQVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QAbstractAnimationTimer_*> *in_RDI;
  QAbstractAnimationTimer **where;
  GrowthPosition pos;
  QAbstractAnimationTimer *tmp;
  bool detach;
  QArrayDataPointer<QAbstractAnimationTimer_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  QAbstractAnimationTimer *pQVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<QAbstractAnimationTimer_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QAbstractAnimationTimer_*>::freeSpaceAtEnd
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppQVar3 = QArrayDataPointer<QAbstractAnimationTimer_*>::end(in_RDI);
      *ppQVar3 = (QAbstractAnimationTimer *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QAbstractAnimationTimer_*>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffc8), qVar2 != 0)) {
      ppQVar3 = QArrayDataPointer<QAbstractAnimationTimer_*>::begin
                          ((QArrayDataPointer<QAbstractAnimationTimer_*> *)0x676c87);
      ppQVar3[-1] = (QAbstractAnimationTimer *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pQVar5 = (QAbstractAnimationTimer *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<QAbstractAnimationTimer_*>::detachAndGrow
            ((QArrayDataPointer<QAbstractAnimationTimer_*> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),(GrowthPosition)((ulong)pQVar5 >> 0x20),
             CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (QAbstractAnimationTimer ***)in_stack_ffffffffffffffc8,in_RDI);
  ppQVar3 = QPodArrayOps<QAbstractAnimationTimer_*>::createHole
                      ((QPodArrayOps<QAbstractAnimationTimer_*> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pQVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppQVar3 = pQVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }